

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::callSolveQp(Highs *this)

{
  HighsModel *this_00;
  HighsInt *pHVar1;
  HighsInt nv;
  double dVar2;
  QpAsmStatus QVar3;
  HighsStatus HVar4;
  double *i_1;
  ulong uVar5;
  iterator __begin2;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  allocator local_461;
  string local_460;
  _Any_data local_440;
  code *local_430;
  code *local_428;
  _Any_data local_420;
  code *local_410;
  code *local_408;
  _Any_data local_400;
  code *local_3f0;
  code *local_3e8;
  Instance instance;
  Settings local_1e0;
  Statistics stats;
  
  nv = (this->model_).lp_.num_col_;
  if (nv < (this->model_).hessian_.dim_) {
    highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                "Hessian dimension = %d is incompatible with matrix dimension = %d\n");
    this->model_status_ = kModelError;
    (this->solution_).value_valid = false;
    (this->solution_).dual_valid = false;
    HVar4 = kError;
  }
  else {
    Instance::Instance(&instance,nv,(this->model_).lp_.num_row_);
    instance.sense = (this->model_).lp_.sense_;
    instance.num_con = (this->model_).lp_.num_row_;
    instance.num_var = (this->model_).lp_.num_col_;
    instance.A.mat.num_row = instance.num_con;
    instance.A.mat.num_col = instance.num_var;
    std::vector<int,_std::allocator<int>_>::operator=
              (&instance.A.mat.start,&(this->model_).lp_.a_matrix_.start_);
    std::vector<int,_std::allocator<int>_>::operator=
              (&instance.A.mat.index,&(this->model_).lp_.a_matrix_.index_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&instance.A.mat.value,&(this->model_).lp_.a_matrix_.value_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&instance.c.value,&(this->model_).lp_.col_cost_);
    instance.offset = (this->model_).lp_.offset_;
    std::vector<double,_std::allocator<double>_>::operator=
              (&instance.con_lo,&(this->model_).lp_.row_lower_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&instance.con_up,&(this->model_).lp_.row_upper_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&instance.var_lo,&(this->model_).lp_.col_lower_);
    std::vector<double,_std::allocator<double>_>::operator=
              (&instance.var_up,&(this->model_).lp_.col_upper_);
    this_00 = &this->model_;
    instance.Q.mat.num_row = (this_00->lp_).num_col_;
    instance.Q.mat.num_col = instance.Q.mat.num_row;
    triangularToSquareHessian
              (&(this->model_).hessian_,&instance.Q.mat.start,&instance.Q.mat.index,
               &instance.Q.mat.value);
    uVar6 = (ulong)((long)instance.c.value.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)instance.c.value.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar7 = 0;
    uVar5 = uVar6 & 0xffffffff;
    if ((int)uVar6 < 1) {
      uVar5 = uVar7;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      if ((instance.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7] != 0.0) ||
         (NAN(instance.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7]))) {
        lVar8 = (long)instance.c.num_nz;
        instance.c.num_nz = instance.c.num_nz + 1;
        instance.c.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] = (int)uVar7;
      }
    }
    if ((this->model_).lp_.sense_ == kMaximize) {
      for (; instance.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start !=
             instance.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
          instance.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               instance.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1) {
        *instance.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start =
             -*instance.c.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      }
      for (; instance.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start !=
             instance.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
          instance.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               instance.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1) {
        *instance.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start =
             -*instance.Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      }
    }
    local_1e0.ratiotest = TwoPass;
    local_1e0.ratiotest_t = 1e-09;
    local_1e0.ratiotest_d = 1e-08;
    local_1e0.pricing = Devex;
    local_1e0.pnorm_zero_threshold = 1e-11;
    local_1e0.improvement_zero_threshold = 0.0001;
    local_1e0.d_zero_threshold = 1e-12;
    local_1e0.lambda_zero_threshold = 1e-09;
    local_1e0.pQp_zero_threshold = 1e-07;
    local_1e0.hessianregularization = false;
    local_1e0.hessianregularizationfactor = 1e-07;
    local_1e0.phase1strategy = HIGHS;
    local_1e0.phase1movefreevarsbasic = false;
    local_1e0.phase1boundfreevars = false;
    local_1e0.iteration_log.subscribers.
    super__Vector_base<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e0.iteration_log.subscribers.
    super__Vector_base<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e0.iteration_log.subscribers.
    super__Vector_base<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e0.qp_model_status_log.subscribers.
    super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e0.nullspace_limit_log.subscribers.
    super__Vector_base<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e0.qp_model_status_log.subscribers.
    super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e0.qp_model_status_log.subscribers.
    super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e0.nullspace_limit_log.subscribers.
    super__Vector_base<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e0.nullspace_limit_log.subscribers.
    super__Vector_base<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e0.reinvertfrequency = 1000;
    local_1e0.gradientrecomputefrequency = 100;
    local_1e0.reducedgradientrecomputefrequency = 0;
    local_1e0.reducedhessianrecomputefrequency = 0;
    local_1e0.time_limit = INFINITY;
    local_1e0.rowscaling = true;
    local_1e0.varscaling = true;
    local_1e0.perturbation = false;
    memset(&stats,0,0xd8);
    local_1e0.reportingfequency = 100;
    local_1e0.iteration_limit = (this->options_).super_HighsOptionsStruct.qp_iteration_limit;
    local_1e0.nullspace_limit = (this->options_).super_HighsOptionsStruct.qp_nullspace_limit;
    local_400._8_8_ = 0;
    local_3e8 = std::
                _Function_handler<void_(QpModelStatus_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3814:7)>
                ::_M_invoke;
    local_3f0 = std::
                _Function_handler<void_(QpModelStatus_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3814:7)>
                ::_M_manager;
    local_400._M_unused._M_object = this;
    std::
    vector<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
    ::push_back(&local_1e0.qp_model_status_log.subscribers,(value_type *)&local_400);
    std::_Function_base::~_Function_base((_Function_base *)&local_400);
    local_420._8_8_ = 0;
    local_408 = std::
                _Function_handler<void_(Statistics_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3825:36)>
                ::_M_invoke;
    local_410 = std::
                _Function_handler<void_(Statistics_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3825:36)>
                ::_M_manager;
    local_420._M_unused._M_object = this;
    std::
    vector<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
    ::push_back(&local_1e0.iteration_log.subscribers,(value_type *)&local_420);
    std::_Function_base::~_Function_base((_Function_base *)&local_420);
    local_440._8_8_ = 0;
    local_428 = std::
                _Function_handler<void_(int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3837:42)>
                ::_M_invoke;
    local_430 = std::
                _Function_handler<void_(int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/lp_data/Highs.cpp:3837:42)>
                ::_M_manager;
    local_440._M_unused._M_object = this;
    std::vector<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>::
    push_back(&local_1e0.nullspace_limit_log.subscribers,(value_type *)&local_440);
    std::_Function_base::~_Function_base((_Function_base *)&local_440);
    local_1e0.time_limit = (this->options_).super_HighsOptionsStruct.time_limit;
    local_1e0.lambda_zero_threshold =
         (this->options_).super_HighsOptionsStruct.dual_feasibility_tolerance;
    uVar5 = (ulong)(uint)(this->options_).super_HighsOptionsStruct.
                         simplex_primal_edge_weight_strategy;
    if (uVar5 < 3) {
      local_1e0.pricing = *(PricingStrategy *)(&DAT_003a2860 + uVar5 * 4);
    }
    else {
      local_1e0.pricing = Devex;
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                 "  Iteration        Objective     NullspaceDim\n");
    QVar3 = solveqp(&instance,&local_1e0,&stats,&this->model_status_,&this->basis_,&this->solution_,
                    &this->timer_);
    if (QVar3 == kError) {
      HVar4 = kError;
    }
    else {
      dVar2 = HighsModel::objectiveValue(this_00,&(this->solution_).col_value);
      (this->info_).super_HighsInfoStruct.objective_function_value = dVar2;
      getKktFailures(&this->options_,this_00,&this->solution_,&this->basis_,&this->info_);
      pHVar1 = &(this->info_).super_HighsInfoStruct.simplex_iteration_count;
      *pHVar1 = *pHVar1 + stats.phase1_iterations;
      pHVar1 = &(this->info_).super_HighsInfoStruct.qp_iteration_count;
      *pHVar1 = *pHVar1 + stats.num_iterations;
      (this->info_).super_HighsInfoStruct.valid = true;
      if (this->model_status_ == kOptimal) {
        std::__cxx11::string::string((string *)&local_460,"QP",&local_461);
        HVar4 = checkOptimality(this,&local_460);
        std::__cxx11::string::~string((string *)&local_460);
      }
      else {
        HVar4 = (HighsStatus)(QVar3 == kWarning);
      }
    }
    Statistics::~Statistics(&stats);
    Settings::~Settings(&local_1e0);
    Instance::~Instance(&instance);
  }
  return HVar4;
}

Assistant:

HighsStatus Highs::callSolveQp() {
  // Check that the model is column-wise
  HighsLp& lp = model_.lp_;
  HighsHessian& hessian = model_.hessian_;
  assert(model_.lp_.a_matrix_.isColwise());
  if (hessian.dim_ > lp.num_col_) {
    highsLogDev(
        options_.log_options, HighsLogType::kError,
        "Hessian dimension = %d is incompatible with matrix dimension = %d\n",
        int(hessian.dim_), int(lp.num_col_));
    model_status_ = HighsModelStatus::kModelError;
    solution_.value_valid = false;
    solution_.dual_valid = false;
    return HighsStatus::kError;
  }
  //
  // Run the QP solver
  Instance instance(lp.num_col_, lp.num_row_);

  instance.sense = HighsInt(lp.sense_);
  instance.num_con = lp.num_row_;
  instance.num_var = lp.num_col_;

  instance.A.mat.num_col = lp.num_col_;
  instance.A.mat.num_row = lp.num_row_;
  instance.A.mat.start = lp.a_matrix_.start_;
  instance.A.mat.index = lp.a_matrix_.index_;
  instance.A.mat.value = lp.a_matrix_.value_;
  instance.c.value = lp.col_cost_;
  instance.offset = lp.offset_;
  instance.con_lo = lp.row_lower_;
  instance.con_up = lp.row_upper_;
  instance.var_lo = lp.col_lower_;
  instance.var_up = lp.col_upper_;
  instance.Q.mat.num_col = lp.num_col_;
  instance.Q.mat.num_row = lp.num_col_;
  triangularToSquareHessian(hessian, instance.Q.mat.start, instance.Q.mat.index,
                            instance.Q.mat.value);

  for (HighsInt i = 0; i < (HighsInt)instance.c.value.size(); i++) {
    if (instance.c.value[i] != 0.0) {
      instance.c.index[instance.c.num_nz++] = i;
    }
  }

  if (lp.sense_ == ObjSense::kMaximize) {
    // Negate the vector and Hessian
    for (double& i : instance.c.value) {
      i *= -1.0;
    }
    for (double& i : instance.Q.mat.value) {
      i *= -1.0;
    }
  }

  Settings settings;
  Statistics stats;

  settings.reportingfequency = 100;

  // Setting qp_update_limit = 10 leads to error with lpHighs3
  const HighsInt qp_update_limit = 1000;  // 1000; // default
  if (qp_update_limit != settings.reinvertfrequency) {
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Changing QP reinversion frequency from %d to %d\n",
                 int(settings.reinvertfrequency), int(qp_update_limit));
    settings.reinvertfrequency = qp_update_limit;
  }

  settings.iteration_limit = options_.qp_iteration_limit;
  settings.nullspace_limit = options_.qp_nullspace_limit;

  // Define the QP model status logging function
  settings.qp_model_status_log.subscribe(
      [this](QpModelStatus& qp_model_status) {
        if (qp_model_status == QpModelStatus::kUndetermined ||
            qp_model_status == QpModelStatus::kLargeNullspace ||
            qp_model_status == QpModelStatus::kError ||
            qp_model_status == QpModelStatus::kNotset)
          highsLogUser(options_.log_options, HighsLogType::kInfo,
                       "QP solver model status: %s\n",
                       qpModelStatusToString(qp_model_status).c_str());
      });

  // Define the QP solver iteration logging function
  settings.iteration_log.subscribe([this](Statistics& stats) {
    int rep = stats.iteration.size() - 1;
    std::string time_string =
        options_.timeless_log ? ""
                              : highsFormatToString(" %9.2fs", stats.time[rep]);
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "%11d  %15.8g           %6d%s\n", int(stats.iteration[rep]),
                 stats.objval[rep], int(stats.nullspacedimension[rep]),
                 time_string.c_str());
  });

  // Define the QP nullspace limit logging function
  settings.nullspace_limit_log.subscribe([this](HighsInt& nullspace_limit) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "QP solver has exceeded nullspace limit of %d\n",
                 int(nullspace_limit));
  });

  settings.time_limit = options_.time_limit;
  settings.lambda_zero_threshold = options_.dual_feasibility_tolerance;

  switch (options_.simplex_primal_edge_weight_strategy) {
    case 0:
      settings.pricing = PricingStrategy::DantzigWolfe;
      break;
    case 1:
      settings.pricing = PricingStrategy::Devex;
      break;
    case 2:
      settings.pricing = PricingStrategy::SteepestEdge;
      break;
    default:
      settings.pricing = PricingStrategy::Devex;
  }

  // print header for QP solver output
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "  Iteration        Objective     NullspaceDim\n");

  QpAsmStatus status = solveqp(instance, settings, stats, model_status_, basis_,
                               solution_, timer_);
  // QP solver can fail, so should return something other than QpAsmStatus::kOk
  if (status == QpAsmStatus::kError) return HighsStatus::kError;

  assert(status == QpAsmStatus::kOk || status == QpAsmStatus::kWarning);
  HighsStatus return_status = status == QpAsmStatus::kWarning
                                  ? HighsStatus::kWarning
                                  : HighsStatus::kOk;

  // Get the objective and any KKT failures
  info_.objective_function_value = model_.objectiveValue(solution_.col_value);
  getKktFailures(options_, model_, solution_, basis_, info_);
  // Set the QP-specific values of info_
  info_.simplex_iteration_count += stats.phase1_iterations;
  info_.qp_iteration_count += stats.num_iterations;
  info_.valid = true;
  if (model_status_ == HighsModelStatus::kOptimal) return checkOptimality("QP");
  return return_status;
}